

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unixSync(unqlite_file *id,int flags)

{
  int iVar1;
  int *piVar2;
  int err;
  int isFullsync;
  int isDataOnly;
  unixFile *pFile;
  int rc;
  int flags_local;
  unqlite_file *id_local;
  
  iVar1 = full_fsync(*(int *)&id[2].pMethods,(uint)((flags & 0xfU) == 3),flags & 0x10);
  if (iVar1 == 0) {
    pFile._0_4_ = 0;
    if (-1 < *(int *)((long)&id[2].pMethods + 4)) {
      full_fsync(*(int *)((long)&id[2].pMethods + 4),0,0);
      iVar1 = close(*(int *)((long)&id[2].pMethods + 4));
      if (iVar1 == 0) {
        *(undefined4 *)((long)&id[2].pMethods + 4) = 0xffffffff;
      }
      else {
        piVar2 = __errno_location();
        *(int *)((long)&id[3].pMethods + 4) = *piVar2;
        pFile._0_4_ = -2;
      }
    }
    id_local._4_4_ = (int)pFile;
  }
  else {
    piVar2 = __errno_location();
    *(int *)((long)&id[3].pMethods + 4) = *piVar2;
    id_local._4_4_ = -2;
  }
  return id_local._4_4_;
}

Assistant:

static int unixSync(unqlite_file *id, int flags){
  int rc;
  unixFile *pFile = (unixFile*)id;

  int isDataOnly = (flags&UNQLITE_SYNC_DATAONLY);
  int isFullsync = (flags&0x0F)==UNQLITE_SYNC_FULL;

  rc = full_fsync(pFile->h, isFullsync, isDataOnly);

  if( rc ){
    pFile->lastErrno = errno;
    return UNQLITE_IOERR;
  }
  if( pFile->dirfd>=0 ){
    int err;
#ifndef UNQLITE_DISABLE_DIRSYNC
    /* The directory sync is only attempted if full_fsync is
    ** turned off or unavailable.  If a full_fsync occurred above,
    ** then the directory sync is superfluous.
    */
    if( (!HAVE_FULLFSYNC || !isFullsync) && full_fsync(pFile->dirfd,0,0) ){
       /*
       ** We have received multiple reports of fsync() returning
       ** errors when applied to directories on certain file systems.
       ** A failed directory sync is not a big deal.  So it seems
       ** better to ignore the error.  Ticket #1657
       */
       /* pFile->lastErrno = errno; */
       /* return UNQLITE_IOERR; */
    }
#endif
    err = close(pFile->dirfd); /* Only need to sync once, so close the */
    if( err==0 ){              /* directory when we are done */
      pFile->dirfd = -1;
    }else{
      pFile->lastErrno = errno;
      rc = UNQLITE_IOERR;
    }
  }
  return rc;
}